

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::generate_free_func_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype)

{
  uint uVar1;
  t_type *ttype_00;
  undefined8 uVar2;
  undefined8 *puVar3;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  t_base local_4c;
  t_base_type *ptStack_48;
  t_base tbase_1;
  t_type *etype;
  t_base local_38;
  t_base tbase;
  allocator local_21;
  t_typedef *local_20;
  t_type *ttype_local;
  t_c_glib_generator *this_local;
  
  local_20 = (t_typedef *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_c_glib_generator *)__return_storage_ptr__;
  if (ttype == (t_type *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NULL",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc._vptr_t_doc[10]
              )();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc._vptr_t_doc
                  [0x10])();
        if (((uVar1 & 1) == 0) &&
           (uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc.
                      _vptr_t_doc[0xf])(), (uVar1 & 1) == 0)) {
          uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc._vptr_t_doc
                    [0xb])();
          if ((uVar1 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"g_object_unref",
                       (allocator *)((long)&etype + 2));
            std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 2));
            return __return_storage_ptr__;
          }
          uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc._vptr_t_doc
                    [0xe])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc.
                      _vptr_t_doc[9])();
            if ((uVar1 & 1) != 0) {
              ttype_00 = t_typedef::get_type(local_20);
              generate_free_func_from_type_abi_cxx11_(__return_storage_ptr__,this,ttype_00);
              return __return_storage_ptr__;
            }
            (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
            uVar2 = std::__cxx11::string::c_str();
            printf("Type not expected: %s\n",uVar2);
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = "Type not expected";
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          ptStack_48 = (t_base_type *)t_list::get_elem_type((t_list *)local_20);
          uVar1 = (*(ptStack_48->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_48->super_t_type).super_t_doc._vptr_t_doc[0xd])();
            if (((uVar1 & 1) == 0) &&
               (uVar1 = (*(ptStack_48->super_t_type).super_t_doc._vptr_t_doc[0xb])(),
               (uVar1 & 1) == 0)) {
              uVar1 = (*(ptStack_48->super_t_type).super_t_doc._vptr_t_doc[10])();
              if ((uVar1 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,"(GDestroyNotify) g_array_unref",
                           &local_50);
                std::allocator<char>::~allocator((allocator<char> *)&local_50);
                return __return_storage_ptr__;
              }
              (*(ptStack_48->super_t_type).super_t_doc._vptr_t_doc[3])();
              uVar2 = std::__cxx11::string::c_str();
              printf("Type not expected inside the array: %s\n",uVar2);
              puVar3 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar3 = "Type not expected inside array";
              __cxa_throw(puVar3,&char_const*::typeinfo,0);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"(GDestroyNotify) g_ptr_array_unref",
                       &local_4f);
            std::allocator<char>::~allocator((allocator<char> *)&local_4f);
            return __return_storage_ptr__;
          }
          local_4c = t_base_type::get_base(ptStack_48);
          if (local_4c == TYPE_VOID) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = "compiler error: cannot determine array type";
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          if (local_4c != TYPE_STRING) {
            if (local_4c - TYPE_BOOL < 6) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"(GDestroyNotify) g_array_unref",&local_4d
                        );
              std::allocator<char>::~allocator((allocator<char> *)&local_4d);
              return __return_storage_ptr__;
            }
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = "compiler error: no array info for type";
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"(GDestroyNotify) g_ptr_array_unref",&local_4e
                    );
          std::allocator<char>::~allocator((allocator<char> *)&local_4e);
          return __return_storage_ptr__;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   "(GDestroyNotify) thrift_safe_hash_table_destroy",(allocator *)((long)&etype + 3)
                  );
        std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 3));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"NULL",(allocator *)((long)&etype + 4));
        std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 4));
      }
    }
    else {
      local_38 = t_base_type::get_base((t_base_type *)local_20);
      if (local_38 == TYPE_VOID) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "compiler error: cannot determine hash type";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
      if (local_38 == TYPE_STRING) {
        uVar1 = (*(((t_container *)&local_20->super_t_type)->super_t_type).super_t_doc._vptr_t_doc
                  [7])();
        if ((uVar1 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"g_free",(allocator *)((long)&etype + 5));
          std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 5));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"thrift_string_free",
                     (allocator *)((long)&etype + 6));
          std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 6));
        }
      }
      else {
        if (5 < local_38 - TYPE_BOOL) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "compiler error: no hash table info for type";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"g_free",(allocator *)((long)&etype + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&etype + 7));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::generate_free_func_from_type(t_type* ttype) {
  if (ttype == nullptr)
    return "NULL";

  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot determine hash type";
      break;
    case t_base_type::TYPE_BOOL:
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
    case t_base_type::TYPE_DOUBLE:
      return "g_free";
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)ttype)->is_binary()) {
        return "thrift_string_free";
      }
      return "g_free";
    default:
      throw "compiler error: no hash table info for type";
    }
  } else if (ttype->is_enum()) {
    return "NULL";
  } else if (ttype->is_map() || ttype->is_set()) {
    return "(GDestroyNotify) thrift_safe_hash_table_destroy";
  } else if (ttype->is_struct()) {
    return "g_object_unref";
  } else if (ttype->is_list()) {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    if (etype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)etype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot determine array type";
        break;
      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        return "(GDestroyNotify) g_array_unref";
      case t_base_type::TYPE_STRING:
        return "(GDestroyNotify) g_ptr_array_unref";
      default:
        throw "compiler error: no array info for type";
      }
    } else if (etype->is_container() || etype->is_struct()) {
      return "(GDestroyNotify) g_ptr_array_unref";
      ;
    } else if (etype->is_enum()) {
      return "(GDestroyNotify) g_array_unref";
    }
    printf("Type not expected inside the array: %s\n", etype->get_name().c_str());
    throw "Type not expected inside array";
  } else if (ttype->is_typedef()) {
    return generate_free_func_from_type(((t_typedef*)ttype)->get_type());
  }
  printf("Type not expected: %s\n", ttype->get_name().c_str());
  throw "Type not expected";
}